

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_first_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this)

{
  lexical_analyzer_t<cfgfile::string_trait_t> *this_00;
  bool bVar1;
  exception_t<cfgfile::string_trait_t> *peVar2;
  bool bVar3;
  allocator local_2f5;
  allocator local_2f4;
  allocator local_2f3;
  allocator local_2f2;
  allocator local_2f1;
  undefined1 local_2f0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  string local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  allocator local_c8 [32];
  lexeme_t<cfgfile::string_trait_t> lexeme;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = &this->m_lex;
  lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(&lexeme,this_00);
  if (((this->super_parser_base_t<cfgfile::string_trait_t>).m_tag)->m_is_mandatory == true) {
    if (lexeme.m_type == null) {
      peVar2 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_1e8,"Unexpected end of file. Undefined mandatory tag \"",local_c8)
      ;
      std::__cxx11::string::string((string *)&local_1c8,(string *)&local_1e8);
      std::operator+(&local_1a8,&local_1c8,
                     &((this->super_parser_base_t<cfgfile::string_trait_t>).m_tag)->m_name);
      std::__cxx11::string::string(local_228,"\". In file \"",(allocator *)&local_e8);
      std::__cxx11::string::string((string *)&local_208,local_228);
      std::operator+(&local_188,&local_1a8,&local_208);
      std::operator+(&local_168,&local_188,&this_00->m_stream->m_file_name);
      std::__cxx11::string::string(local_268,"\" on line ",(allocator *)&local_108);
      std::__cxx11::string::string((string *)&local_248,local_268);
      std::operator+(&local_148,&local_168,&local_248);
      std::__cxx11::to_string(&local_288,(this->m_lex).m_line_number);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                     &local_148,&local_288);
      std::__cxx11::string::string((string *)&local_2c8,".",local_128);
      std::__cxx11::string::string((string *)&local_2a8,(string *)&local_2c8);
      std::operator+(&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                     &local_2a8);
      exception_t<cfgfile::string_trait_t>::exception_t(peVar2,&local_40);
      __cxa_throw(peVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  else if (lexeme.m_type == null) {
    bVar3 = false;
    goto LAB_001170e6;
  }
  if (lexeme.m_type != start) {
    peVar2 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1e8,"Expected start curl brace, but we\'ve got \"",local_c8);
    std::__cxx11::string::string((string *)&local_1c8,(string *)&local_1e8);
    std::operator+(&local_1a8,&local_1c8,&lexeme.m_value);
    std::__cxx11::string::string(local_228,"\". In file \"",(allocator *)&local_e8);
    std::__cxx11::string::string((string *)&local_208,local_228);
    std::operator+(&local_188,&local_1a8,&local_208);
    std::operator+(&local_168,&local_188,&this_00->m_stream->m_file_name);
    std::__cxx11::string::string(local_268,"\" on line ",(allocator *)&local_108);
    std::__cxx11::string::string((string *)&local_248,local_268);
    std::operator+(&local_148,&local_168,&local_248);
    std::__cxx11::to_string(&local_288,(this->m_lex).m_line_number);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   &local_148,&local_288);
    std::__cxx11::string::string((string *)&local_2c8,".",local_128);
    std::__cxx11::string::string((string *)&local_2a8,(string *)&local_2c8);
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   &local_2a8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar2,&local_60);
    __cxa_throw(peVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme
            ((lexeme_t<cfgfile::string_trait_t> *)local_2f0,this_00);
  lexeme_t<cfgfile::string_trait_t>::operator=
            (&lexeme,(lexeme_t<cfgfile::string_trait_t> *)local_2f0);
  std::__cxx11::string::~string((string *)(local_2f0 + 8));
  bVar1 = start_tag_parsing(this,&lexeme,(this->super_parser_base_t<cfgfile::string_trait_t>).m_tag)
  ;
  bVar3 = true;
  if (!bVar1) {
    peVar2 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_228,"Unexpected tag name. We expected \"",&local_2f1);
    std::__cxx11::string::string((string *)&local_208,local_228);
    std::operator+(&local_1e8,&local_208,
                   &((this->super_parser_base_t<cfgfile::string_trait_t>).m_tag)->m_name);
    std::__cxx11::string::string(local_268,"\", but we\'ve got \"",&local_2f2);
    std::__cxx11::string::string((string *)&local_248,local_268);
    std::operator+(&local_1c8,&local_1e8,&local_248);
    std::operator+(&local_1a8,&local_1c8,&lexeme.m_value);
    std::__cxx11::string::string((string *)&local_2a8,"\". In file \"",&local_2f3);
    std::__cxx11::string::string((string *)&local_288,(string *)&local_2a8);
    std::operator+(&local_188,&local_1a8,&local_288);
    std::operator+(&local_168,&local_188,&this_00->m_stream->m_file_name);
    std::__cxx11::string::string((string *)local_c8,"\" on line ",&local_2f4);
    std::__cxx11::string::string((string *)&local_2c8,(string *)local_c8);
    std::operator+(&local_148,&local_168,&local_2c8);
    std::__cxx11::to_string(&local_e8,(this->m_lex).m_line_number);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   &local_148,&local_e8);
    std::__cxx11::string::string((string *)local_128,".",&local_2f5);
    std::__cxx11::string::string((string *)&local_108,(string *)local_128);
    std::operator+(&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   &local_108);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar2,&local_80);
    __cxa_throw(peVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
LAB_001170e6:
  std::__cxx11::string::~string((string *)&lexeme.m_value);
  return bVar3;
}

Assistant:

bool start_first_tag_parsing()
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		if( this->m_tag.is_mandatory() && lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Undefined mandatory tag \"" ) + this->m_tag.name() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( !this->m_tag.is_mandatory() &&
			lexeme.type() == lexeme_type_t::null )
				return false;
		else if( lexeme.type() != lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Expected start curl brace, "
					"but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );

		lexeme = m_lex.next_lexeme();

		if( !start_tag_parsing( lexeme, this->m_tag ) )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected \"" ) + this->m_tag.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );

		return true;
	}